

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

ElabSystemTaskSyntax * __thiscall
slang::parsing::Parser::parseElabSystemTask(Parser *this,AttrList attributes)

{
  bool bVar1;
  uint uVar2;
  ArgumentListSyntax *arguments;
  ElabSystemTaskSyntax *pEVar3;
  ushort uVar4;
  uint *puVar5;
  string_view sVar6;
  Token name;
  Token semi;
  Token local_68;
  SyntaxNode *local_58;
  SyntaxNode *pSStack_50;
  size_t local_48;
  pointer local_40;
  __extent_storage<18446744073709551615UL> local_38;
  
  local_68 = ParserBase::peek(&this->super_ParserBase);
  sVar6 = Token::valueText(&local_68);
  puVar5 = (uint *)sVar6._M_str;
  switch(sVar6._M_len) {
  case 5:
    uVar2 = *puVar5 ^ 0x666e6924;
    uVar4 = (byte)puVar5[1] ^ 0x6f;
    goto LAB_001e83e1;
  case 6:
    if ((short)puVar5[1] == 0x6c61 && *puVar5 == 0x74616624) goto LAB_001e840c;
    uVar2 = *puVar5 ^ 0x72726524;
    uVar4 = (ushort)puVar5[1] ^ 0x726f;
LAB_001e83e1:
    if (uVar4 == 0 && uVar2 == 0) {
LAB_001e840c:
      name = ParserBase::consume(&this->super_ParserBase);
      bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
      if (bVar1) {
        arguments = parseArgumentList(this);
      }
      else {
        arguments = (ArgumentListSyntax *)0x0;
      }
      local_68.info._0_4_ = 1;
      local_58 = (SyntaxNode *)0x0;
      pSStack_50 = (SyntaxNode *)0x0;
      local_68._0_8_ = &PTR_getChild_00623138;
      local_48 = attributes._M_extent._M_extent_value._M_extent_value;
      local_40 = attributes._M_ptr;
      local_38._M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
      semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
      pEVar3 = slang::syntax::SyntaxFactory::elabSystemTask
                         (&this->factory,
                          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_68,name,
                          arguments,semi);
      return pEVar3;
    }
    break;
  case 8:
    if (*(long *)puVar5 == 0x676e696e72617724) goto LAB_001e840c;
    break;
  case 0xe:
    if (*(long *)((long)puVar5 + 6) == 0x7472657373615f63 && *(long *)puVar5 == 0x5f63697461747324)
    goto LAB_001e840c;
  }
  return (ElabSystemTaskSyntax *)0x0;
}

Assistant:

ElabSystemTaskSyntax* Parser::parseElabSystemTask(AttrList attributes) {
    auto name = peek().valueText();
    if (name != "$fatal"sv && name != "$error"sv && name != "$warning"sv && name != "$info"sv &&
        name != "$static_assert"sv) {
        return nullptr;
    }

    auto nameToken = consume();
    ArgumentListSyntax* argList = nullptr;
    if (peek(TokenKind::OpenParenthesis))
        argList = &parseArgumentList();

    return &factory.elabSystemTask(attributes, nameToken, argList, expect(TokenKind::Semicolon));
}